

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_remove_filter(bcf_hdr_t *hdr,bcf1_t *line,int flt_id,int pass)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((line->unpacked & 2) == 0) {
    hdr = (bcf_hdr_t *)line;
    bcf_unpack(line,2);
  }
  uVar1 = (line->d).n_flt;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if ((line->d).flt[uVar4] == flt_id) goto LAB_001242d3;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    uVar4 = (ulong)uVar1;
  }
LAB_001242d3:
  uVar3 = (uint)uVar4;
  if (uVar3 != uVar1) {
    piVar2 = &(line->d).shared_dirty;
    *(byte *)piVar2 = (byte)*piVar2 | 4;
    if (uVar3 != uVar1 - 1) {
      piVar2 = (line->d).flt;
      hdr = (bcf_hdr_t *)(piVar2 + (uVar4 & 0xffffffff));
      memmove(hdr,piVar2 + (uVar4 & 0xffffffff) + 1,(long)(int)(~uVar3 + uVar1) << 2);
    }
    piVar2 = &(line->d).n_flt;
    *piVar2 = *piVar2 + -1;
    if (pass != 0 && *piVar2 == 0) {
      bcf_add_filter(hdr,line,0);
    }
  }
  return 0;
}

Assistant:

int bcf_remove_filter(const bcf_hdr_t *hdr, bcf1_t *line, int flt_id, int pass)
{
    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( flt_id==line->d.flt[i] ) break;
    if ( i==line->d.n_flt ) return 0;   // the filter is not present
    line->d.shared_dirty |= BCF1_DIRTY_FLT;
    if ( i!=line->d.n_flt-1 ) memmove(line->d.flt+i,line->d.flt+i+1,(line->d.n_flt-i-1)*sizeof(*line->d.flt));
    line->d.n_flt--;
    if ( !line->d.n_flt && pass ) bcf_add_filter(hdr,line,0);
    return 0;
}